

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
::dx(value_type *__return_storage_ptr__,
    FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
    *this,int i)

{
  int iVar1;
  Fad<Fad<double>_> *pFVar2;
  Fad<double> *pFVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_a0;
  value_type local_90;
  value_type local_70;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_50;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_40;
  
  FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::dx
            (&local_70,&this->left_->fadexpr_,i);
  pFVar2 = this->right_;
  local_a0.fadexpr_.right_ = &pFVar2->val_;
  iVar1 = (pFVar2->dx_).num_elts;
  pFVar3 = (pFVar2->dx_).ptr_to_data;
  local_a0.fadexpr_.left_ = &local_70;
  FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::
  val(&local_90,&this->left_->fadexpr_);
  local_50.fadexpr_.left_ = pFVar3 + i;
  if (iVar1 == 0) {
    local_50.fadexpr_.left_ = &pFVar2->defaultVal;
  }
  local_40.fadexpr_.right_ = &local_50;
  local_40.fadexpr_.left_ = &local_a0;
  local_50.fadexpr_.right_ = &local_90;
  Fad<double>::
  Fad<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_40);
  Fad<double>::~Fad(&local_90);
  Fad<double>::~Fad(&local_70);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}